

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O3

void wallet::CachedTxGetAmounts
               (CWallet *wallet,CWalletTx *wtx,
               list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *listReceived,
               list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *listSent,
               CAmount *nFee,isminefilter *filter,bool include_change)

{
  CTxOut *txout;
  uint uVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar3;
  isminetype iVar4;
  uint uVar5;
  CAmount CVar6;
  CAmount CVar7;
  pointer pCVar8;
  _Node *p_Var9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  CScript *scriptPubKey;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  COutputEntry output;
  CTxDestination address;
  undefined8 in_stack_fffffffffffffeb8;
  list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>> *plVar13;
  list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>> *plVar14;
  unique_lock<std::recursive_mutex> local_118;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_108;
  CAmount local_b8;
  int local_b0;
  string local_a8;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *nFee = 0;
  std::__cxx11::_List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::_M_clear
            (&listReceived->
              super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>);
  (listReceived->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)listReceived;
  (listReceived->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)listReceived;
  (listReceived->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>).
  _M_impl._M_node._M_size = 0;
  std::__cxx11::_List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::_M_clear
            (&listSent->
              super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>);
  (listSent->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)listSent;
  (listSent->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)listSent;
  (listSent->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>)._M_impl.
  _M_node._M_size = 0;
  CVar6 = CachedTxGetDebit(wallet,wtx,filter);
  if (0 < CVar6) {
    CVar7 = CTransaction::GetValueOut
                      ((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    *nFee = CVar6 - CVar7;
  }
  local_118._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_118._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_118);
  peVar2 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar8 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar8) {
    uVar12 = 0;
    do {
      txout = pCVar8 + uVar12;
      iVar4 = CWallet::IsMine(wallet,txout);
      iVar11 = (int)uVar12;
      plVar13 = (list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>> *)listReceived;
      plVar14 = (list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>> *)listSent;
      if (CVar6 < 1) {
        if ((*filter & iVar4) != ISMINE_NO) goto LAB_00b86f6e;
      }
      else if ((include_change) ||
              (bVar3 = ScriptIsChange(wallet,&txout->scriptPubKey),
              plVar13 = (list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>> *)
                        listReceived,
              plVar14 = (list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>> *)listSent,
              !bVar3)) {
LAB_00b86f6e:
        local_88._16_8_ = 0;
        local_88._24_8_ = 0;
        local_88._0_8_ = 0;
        local_88._8_8_ = 0;
        local_40 = 0;
        scriptPubKey = &txout->scriptPubKey;
        bVar3 = ExtractDestination(scriptPubKey,(CTxDestination *)&local_88._M_first);
        if (!bVar3) {
          uVar1 = (txout->scriptPubKey).super_CScriptBase._size;
          uVar5 = uVar1 - 0x1d;
          if (uVar1 < 0x1d) {
            uVar5 = uVar1;
          }
          if (uVar5 != 0) {
            if (0x1c < uVar1) {
              scriptPubKey = (CScript *)
                             (scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
            }
            if ((10000 < uVar5) || ((scriptPubKey->super_CScriptBase)._union.direct[0] == 'j'))
            goto LAB_00b87058;
          }
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_a8,
                     &((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash);
          parameters._M_string_length = (size_type)wallet;
          parameters._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
          parameters.field_2._M_allocated_capacity = (size_type)plVar13;
          parameters.field_2._8_8_ = plVar14;
          CWallet::WalletLogPrintf<std::__cxx11::string>
                    (wallet,"CWalletTx::GetAmounts: Unknown transaction type found, txid %s\n",
                     parameters);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          local_108._16_8_ = 0;
          local_108._24_8_ = 0;
          local_108._0_8_ = (void *)0x0;
          local_108._8_8_ = 0;
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                       *)&local_88._M_first,(CNoDestination *)&local_108._M_first);
          if (0x1c < (uint)local_108._28_4_) {
            free((void *)local_108._0_8_);
          }
        }
LAB_00b87058:
        std::__detail::__variant::
        _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_108._M_first,
                          (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_88._M_first);
        local_b8 = txout->nValue;
        listSent = (list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *)plVar14;
        local_b0 = iVar11;
        if (0 < CVar6) {
          p_Var9 = std::__cxx11::list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>>::
                   _M_create_node<wallet::COutputEntry_const&>
                             (plVar14,(COutputEntry *)&local_108._M_first);
          listSent = (list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *)plVar14;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var9);
          *(size_t *)(plVar14 + 0x10) = *(size_t *)(plVar14 + 0x10) + 1;
        }
        listReceived = (list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *)plVar13;
        if ((*filter & iVar4) != ISMINE_NO) {
          p_Var9 = std::__cxx11::list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>>::
                   _M_create_node<wallet::COutputEntry_const&>
                             (plVar13,(COutputEntry *)&local_108._M_first);
          listReceived = (list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *)
                         plVar13;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var9);
          *(size_t *)(plVar13 + 0x10) = *(size_t *)(plVar13 + 0x10) + 1;
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_108._M_first);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_88._M_first);
      }
      uVar12 = (ulong)(iVar11 + 1);
      peVar2 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar8 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = ((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar8 >> 3) * -0x3333333333333333;
    } while (uVar12 <= uVar10 && uVar10 - uVar12 != 0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CachedTxGetAmounts(const CWallet& wallet, const CWalletTx& wtx,
                  std::list<COutputEntry>& listReceived,
                  std::list<COutputEntry>& listSent, CAmount& nFee, const isminefilter& filter,
                  bool include_change)
{
    nFee = 0;
    listReceived.clear();
    listSent.clear();

    // Compute fee:
    CAmount nDebit = CachedTxGetDebit(wallet, wtx, filter);
    if (nDebit > 0) // debit>0 means we signed/sent this transaction
    {
        CAmount nValueOut = wtx.tx->GetValueOut();
        nFee = nDebit - nValueOut;
    }

    LOCK(wallet.cs_wallet);
    // Sent/received.
    for (unsigned int i = 0; i < wtx.tx->vout.size(); ++i)
    {
        const CTxOut& txout = wtx.tx->vout[i];
        isminetype fIsMine = wallet.IsMine(txout);
        // Only need to handle txouts if AT LEAST one of these is true:
        //   1) they debit from us (sent)
        //   2) the output is to us (received)
        if (nDebit > 0)
        {
            if (!include_change && OutputIsChange(wallet, txout))
                continue;
        }
        else if (!(fIsMine & filter))
            continue;

        // In either case, we need to get the destination address
        CTxDestination address;

        if (!ExtractDestination(txout.scriptPubKey, address) && !txout.scriptPubKey.IsUnspendable())
        {
            wallet.WalletLogPrintf("CWalletTx::GetAmounts: Unknown transaction type found, txid %s\n",
                                    wtx.GetHash().ToString());
            address = CNoDestination();
        }

        COutputEntry output = {address, txout.nValue, (int)i};

        // If we are debited by the transaction, add the output as a "sent" entry
        if (nDebit > 0)
            listSent.push_back(output);

        // If we are receiving the output, add it as a "received" entry
        if (fIsMine & filter)
            listReceived.push_back(output);
    }

}